

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_andor(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  int32_t iVar2;
  uint32_t uVar3;
  int iVar4;
  
  iVar2 = get_child_list_count(node);
  if (iVar2 == node->info->inner_num) {
    pmVar1 = node->child->next;
    uVar3 = verify_miniscript_andor_property
                      (node->child->type_properties,pmVar1->type_properties,
                       pmVar1->next->type_properties);
    node->type_properties = uVar3;
    iVar4 = (uint)(uVar3 != 0) * 2 + -2;
  }
  else {
    iVar4 = -2;
  }
  return iVar4;
}

Assistant:

static int verify_miniscript_andor(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if (get_child_list_count(node) != node->info->inner_num)
        return WALLY_EINVAL;

    node->type_properties = verify_miniscript_andor_property(
        node->child->type_properties,
        node->child->next->type_properties,
        node->child->next->next->type_properties);
    if (!node->type_properties)
        return WALLY_EINVAL;

    return WALLY_OK;
}